

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_replace(REF_CAVITY ref_cavity)

{
  REF_GRID pRVar1;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_INT *pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  REF_STATUS RVar5;
  uint uVar6;
  long lVar7;
  REF_ADJ pRVar8;
  int iVar9;
  long lVar10;
  undefined8 uVar11;
  REF_CELL pRVar12;
  ulong uVar13;
  int iVar14;
  char *pcVar15;
  REF_CELL pRVar16;
  long lVar17;
  ulong uVar18;
  REF_INT local_d4;
  REF_CELL local_d0;
  REF_CELL local_c8;
  REF_LIST ref_list;
  REF_CELL local_b8;
  REF_INT new_cell;
  REF_INT nodes [27];
  REF_DBL volume;
  
  pRVar1 = ref_cavity->ref_grid;
  ref_node = pRVar1->node;
  ref_geom = pRVar1->geom;
  if ((ref_cavity->debug == 0) ||
     (uVar4 = ref_cavity_tec(ref_cavity,"ref_cavity_replace.tec"), uVar4 == 0)) {
    uVar18 = (ulong)ref_cavity->state;
    if (uVar18 != 1) {
      pcVar15 = "attempt to replace cavity that is not visible";
      uVar11 = 0x283;
LAB_001a17d4:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar11,"ref_cavity_replace",pcVar15,1,uVar18);
      return 1;
    }
    uVar4 = ref_cavity_verify_face_manifold(ref_cavity);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x285,"ref_cavity_replace",(ulong)uVar4,"replace face manifold");
      return 1;
    }
    RVar5 = ref_cavity_verify_seg_manifold(ref_cavity);
    if (RVar5 == 0) {
      uVar18 = (ulong)ref_cavity->state;
      if (uVar18 != 1) {
        pcVar15 = "attempt to replace cavity that is inconsistent";
        uVar11 = 0x289;
        goto LAB_001a17d4;
      }
      if ((((ref_cavity->nseg == 0) && (ref_cavity->nface == 0)) && (ref_cavity->tri_list->n == 0))
         && (ref_cavity->tet_list->n == 0)) {
        pcVar15 = "attempt noop";
        uVar11 = 0x28e;
LAB_001a1b79:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               uVar11,"ref_cavity_replace",pcVar15);
        return 1;
      }
      iVar14 = ref_cavity->node;
      pRVar16 = ref_cavity->ref_grid->cell[8];
      lVar17 = 0;
      while( true ) {
        if (ref_cavity->maxface <= lVar17) break;
        pRVar2 = ref_cavity->f2n;
        iVar9 = pRVar2[lVar17 * 3];
        if (iVar9 != -1) {
          nodes[0] = iVar9;
          nodes[1] = pRVar2[lVar17 * 3 + 1];
          nodes[2] = pRVar2[lVar17 * 3 + 2];
          nodes[3] = iVar14;
          if (((iVar14 != iVar9) && (iVar14 != pRVar2[lVar17 * 3 + 1])) &&
             (iVar14 != pRVar2[lVar17 * 3 + 2])) {
            lVar7 = 0;
            while (lVar7 != 4) {
              lVar10 = (long)nodes[lVar7];
              if (((lVar10 < 0) || (ref_node->max <= nodes[lVar7])) ||
                 (ref_node->global[lVar10] < 0)) {
                pcVar15 = "cavity tet nodes not valid";
                uVar11 = 0x29a;
                goto LAB_001a1b79;
              }
              lVar7 = lVar7 + 1;
              if (ref_node->ref_mpi->id != ref_node->part[lVar10]) {
                pcVar15 = "cavity tet nodes not local";
                uVar11 = 0x29b;
                goto LAB_001a1b79;
              }
            }
            local_c8 = (REF_CELL)CONCAT44(local_c8._4_4_,iVar14);
            local_d0 = pRVar16;
            uVar4 = ref_cell_add(pRVar16,nodes,&local_d4);
            if (uVar4 != 0) {
              pcVar15 = "add";
              uVar11 = 0x29d;
              goto LAB_001a175d;
            }
            uVar4 = ref_node_tet_vol(ref_node,nodes,&volume);
            if (uVar4 != 0) {
              pcVar15 = "norm";
              uVar11 = 0x29e;
              goto LAB_001a175d;
            }
            iVar14 = (int)local_c8;
            pRVar16 = local_d0;
            if (volume <= ref_node->min_volume) {
              printf("%d %d %d %d %e\n",(ulong)(uint)nodes[0],(ulong)(uint)nodes[1],
                     (ulong)(uint)nodes[2],(ulong)(uint)nodes[3]);
              pRVar16 = local_d0;
            }
          }
        }
        lVar17 = lVar17 + 1;
      }
      iVar14 = ref_cavity->surf_node;
      if (iVar14 == -1) {
        iVar14 = ref_cavity->node;
      }
      pRVar16 = ref_cavity->ref_grid->cell[3];
      lVar17 = 0;
      while( true ) {
        if (ref_cavity->maxseg <= lVar17) break;
        pRVar2 = ref_cavity->s2n;
        iVar9 = pRVar2[lVar17 * 3];
        if (iVar9 != -1) {
          nodes[0] = iVar9;
          nodes[1] = pRVar2[lVar17 * 3 + 1];
          nodes[2] = iVar14;
          nodes[3] = pRVar2[lVar17 * 3 + 2];
          if (iVar14 != pRVar2[lVar17 * 3 + 1] && iVar14 != iVar9) {
            lVar7 = 0;
            while (lVar7 != 3) {
              lVar10 = (long)nodes[lVar7];
              if (((lVar10 < 0) || (ref_node->max <= nodes[lVar7])) ||
                 (ref_node->global[lVar10] < 0)) {
                pcVar15 = "cavity tri nodes not valid";
                uVar11 = 0x2ad;
                goto LAB_001a1b79;
              }
              lVar7 = lVar7 + 1;
              if (ref_node->ref_mpi->id != ref_node->part[lVar10]) {
                pcVar15 = "cavity tri nodes not local";
                uVar11 = 0x2ae;
                goto LAB_001a1b79;
              }
            }
            local_d0 = (REF_CELL)CONCAT44(local_d0._4_4_,iVar14);
            uVar4 = ref_cell_add(pRVar16,nodes,&local_d4);
            iVar14 = (int)local_d0;
            if (uVar4 != 0) {
              pcVar15 = "add";
              uVar11 = 0x2b0;
              goto LAB_001a175d;
            }
          }
        }
        lVar17 = lVar17 + 1;
      }
      uVar4 = ref_list_create(&ref_list);
      if (uVar4 == 0) {
        pRVar16 = ref_cavity->ref_grid->cell[8];
        pRVar12 = (REF_CELL)0x0;
        local_c8 = pRVar16;
        do {
          if ((long)ref_cavity->tet_list->n <= (long)pRVar12) {
            local_c8 = ref_cavity->ref_grid->cell[3];
            local_d0 = (REF_CELL)0x0;
            goto LAB_001a1d74;
          }
          local_d4 = ref_cavity->tet_list->value[(long)pRVar12];
          local_d0 = pRVar12;
          uVar4 = ref_cell_nodes(pRVar16,local_d4,nodes);
          if (uVar4 != 0) {
            pcVar15 = "rm";
            uVar11 = 0x2b9;
            goto LAB_001a175d;
          }
          lVar17 = 0;
          while (pRVar16 = local_c8, lVar17 != 4) {
            uVar4 = ref_list_push(ref_list,nodes[lVar17]);
            if (uVar4 != 0) {
              pcVar15 = "tet list";
              uVar11 = 699;
              goto LAB_001a175d;
            }
            lVar7 = (long)nodes[lVar17];
            if (((lVar7 < 0) || (ref_node->max <= nodes[lVar17])) || (ref_node->global[lVar7] < 0))
            {
              pcVar15 = "cavity rm tet nodes not valid";
              uVar11 = 700;
              goto LAB_001a1b79;
            }
            lVar17 = lVar17 + 1;
            if (ref_node->ref_mpi->id != ref_node->part[lVar7]) {
              pcVar15 = "cavity rm tet nodes not local";
              uVar11 = 0x2bd;
              goto LAB_001a1b79;
            }
          }
          uVar4 = ref_cell_remove(local_c8,local_d4);
          pRVar12 = (REF_CELL)((long)&local_d0->type + 1);
        } while (uVar4 == 0);
        pcVar15 = "rm tet";
        uVar11 = 0x2bf;
      }
      else {
        pcVar15 = "create removed node list";
        uVar11 = 0x2b4;
      }
    }
    else {
      pcVar15 = "replace seg manifold";
      uVar4 = 1;
      uVar11 = 0x286;
    }
  }
  else {
    pcVar15 = "tec for replace fail";
    uVar11 = 0x280;
  }
  goto LAB_001a175d;
LAB_001a1f05:
  if ((long)ref_list->n <= (long)local_d0) goto LAB_001a1ff3;
  iVar14 = ref_list->value[(long)local_d0];
  lVar17 = (long)iVar14;
  if (((-1 < lVar17) && (iVar14 < ref_node->max)) && (-1 < ref_node->global[lVar17])) {
    pRVar8 = (*(REF_CELL *)local_c8)->ref_adj;
    iVar9 = pRVar8->nnode;
    if ((iVar9 <= iVar14) || (pRVar8->first[lVar17] == -1)) {
      uVar4 = ref_geom_remove_all(ref_geom,iVar14);
      if (uVar4 != 0) {
        pcVar15 = "remove geom";
        uVar11 = 0x2d2;
        goto LAB_001a175d;
      }
      pRVar8 = (*(REF_CELL *)local_c8)->ref_adj;
      iVar9 = pRVar8->nnode;
    }
    if ((((iVar9 <= iVar14) || (pRVar8->first[lVar17] == -1)) &&
        (((*(REF_CELL *)local_b8)->ref_adj->nnode <= iVar14 ||
         ((*(REF_CELL *)local_b8)->ref_adj->first[lVar17] == -1)))) &&
       (uVar4 = ref_node_remove(ref_node,iVar14), uVar4 != 0)) {
      pcVar15 = "remove node";
      uVar11 = 0x2d6;
      goto LAB_001a175d;
    }
  }
  local_d0 = (REF_CELL)((long)&local_d0->type + 1);
  goto LAB_001a1f05;
LAB_001a1ff3:
  uVar4 = 0;
  if ((ref_cavity->split_node0 != -1) && (ref_cavity->split_node1 != -1)) {
    pRVar16 = ref_cavity->ref_grid->cell[0];
    nodes[0] = ref_cavity->split_node0;
    nodes[1] = ref_cavity->split_node1;
    uVar6 = ref_cell_with(pRVar16,nodes,&local_d4);
    uVar4 = 0;
    if ((uVar6 != 0) && (uVar6 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x2e0,"ref_cavity_replace",(ulong)uVar6,"find edg");
      uVar4 = uVar6;
    }
    if ((uVar6 != 5) && (uVar6 != 0)) {
      return uVar4;
    }
    if (local_d4 != -1) {
      uVar6 = ref_cell_nodes(pRVar16,local_d4,nodes);
      if (uVar6 != 0) {
        pcVar15 = "cell nodes";
        uVar11 = 0x2e2;
LAB_001a2199:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               uVar11,"ref_cavity_replace",(ulong)uVar6,pcVar15);
        return uVar6;
      }
      uVar6 = ref_cell_remove(pRVar16,local_d4);
      if (uVar6 != 0) {
        pcVar15 = "remove";
        uVar11 = 0x2e3;
        goto LAB_001a2199;
      }
      nodes[0] = ref_cavity->split_node0;
      nodes[1] = ref_cavity->surf_node;
      if (nodes[1] == -1) {
        nodes[1] = ref_cavity->node;
      }
      uVar6 = ref_cell_add(pRVar16,nodes,&new_cell);
      if (uVar6 != 0) {
        pcVar15 = "add node0 version";
        uVar11 = 0x2e6;
        goto LAB_001a2199;
      }
      nodes[0] = ref_cavity->surf_node;
      if (nodes[0] == -1) {
        nodes[0] = ref_cavity->node;
      }
      nodes[1] = ref_cavity->split_node1;
      uVar6 = ref_cell_add(pRVar16,nodes,&new_cell);
      if (uVar6 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x2e9,"ref_cavity_replace",(ulong)uVar6,"add node1 version");
        return uVar6;
      }
    }
  }
  if ((ref_cavity->collapse_node0 != -1) && (ref_cavity->collapse_node1 != -1)) {
    pRVar16 = ref_cavity->ref_grid->cell[0];
    nodes[0] = ref_cavity->collapse_node0;
    nodes[1] = ref_cavity->collapse_node1;
    uVar6 = ref_cell_with(pRVar16,nodes,&local_d4);
    if ((uVar6 != 0) && (uVar6 != 5)) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x2f2,"ref_cavity_replace",(ulong)uVar6,"find edg");
      uVar4 = uVar6;
    }
    if ((uVar6 != 5) && (uVar6 != 0)) {
      return uVar4;
    }
    if (local_d4 != -1) {
      uVar4 = ref_cell_nodes(pRVar16,local_d4,nodes);
      if (uVar4 != 0) {
        pcVar15 = "cell nodes";
        uVar11 = 0x2f4;
        goto LAB_001a175d;
      }
      uVar4 = ref_cell_remove(pRVar16,local_d4);
      if (uVar4 != 0) {
        pcVar15 = "remove";
        uVar11 = 0x2f5;
        goto LAB_001a175d;
      }
      uVar4 = ref_cell_replace_node(pRVar16,ref_cavity->collapse_node1,ref_cavity->collapse_node0);
      if (uVar4 != 0) {
        pcVar15 = "replace node";
        uVar11 = 0x2f8;
        goto LAB_001a175d;
      }
    }
  }
  iVar14 = ref_cavity->node;
  pRVar16 = ref_cavity->ref_grid->cell[8];
  uVar18 = 0xffffffff;
  local_d4 = -1;
  if (-1 < (long)iVar14) {
    pRVar8 = pRVar16->ref_adj;
    uVar18 = 0xffffffff;
    local_d4 = -1;
    if (iVar14 < pRVar8->nnode) {
      uVar4 = pRVar8->first[iVar14];
      uVar18 = 0xffffffff;
      local_d4 = -1;
      if ((long)(int)uVar4 != -1) {
        local_d4 = pRVar8->item[(int)uVar4].ref;
        uVar18 = (ulong)uVar4;
      }
    }
  }
  while ((int)uVar18 != -1) {
    uVar4 = ref_cell_nodes(pRVar16,local_d4,nodes);
    if (uVar4 != 0) {
      pcVar15 = "";
      uVar11 = 0x300;
      goto LAB_001a175d;
    }
    lVar17 = 0;
    while (lVar17 != 4) {
      iVar14 = nodes[lVar17];
      if ((((long)iVar14 < 0) || (ref_node->max <= iVar14)) ||
         (lVar17 = lVar17 + 1, ref_node->global[iVar14] < 0)) {
        pcVar15 = "cavity replaced tet nodes not valid";
        uVar11 = 0x303;
        goto LAB_001a1b79;
      }
    }
    pRVar3 = pRVar16->ref_adj->item;
    uVar18 = (ulong)pRVar3[(int)uVar18].next;
    local_d4 = -1;
    if (uVar18 != 0xffffffffffffffff) {
      local_d4 = pRVar3[uVar18].ref;
    }
  }
  if ((pRVar1->twod != 0) || (pRVar1->surf != 0)) {
    local_b8 = local_c8;
  }
  uVar13 = 0;
  uVar18 = (ulong)(uint)ref_list->n;
  if (ref_list->n < 1) {
    uVar18 = uVar13;
  }
  for (; uVar18 != uVar13; uVar13 = uVar13 + 1) {
    iVar14 = ref_list->value[uVar13];
    lVar17 = (long)iVar14;
    if (((-1 < lVar17) && (iVar14 < ref_node->max)) &&
       ((-1 < ref_node->global[lVar17] &&
        (((*(REF_CELL *)local_b8)->ref_adj->nnode <= iVar14 ||
         ((*(REF_CELL *)local_b8)->ref_adj->first[lVar17] == -1)))))) {
      pcVar15 = "element missing for valid node";
      uVar11 = 0x30f;
      goto LAB_001a1b79;
    }
  }
  uVar4 = ref_list_free(ref_list);
  if (uVar4 == 0) {
    return 0;
  }
  pcVar15 = "list free";
  uVar11 = 0x313;
  goto LAB_001a175d;
  while( true ) {
    lVar17 = 0;
    while (lVar17 != 3) {
      uVar4 = ref_list_push(ref_list,nodes[lVar17]);
      if (uVar4 != 0) {
        pcVar15 = "tri list";
        uVar11 = 0x2c7;
        goto LAB_001a175d;
      }
      lVar7 = (long)nodes[lVar17];
      if (((lVar7 < 0) || (ref_node->max <= nodes[lVar17])) || (ref_node->global[lVar7] < 0)) {
        pcVar15 = "cavity rm tri nodes not valid";
        uVar11 = 0x2c8;
        goto LAB_001a1b79;
      }
      lVar17 = lVar17 + 1;
      if (ref_node->ref_mpi->id != ref_node->part[lVar7]) {
        pcVar15 = "cavity rm tri nodes not local";
        uVar11 = 0x2c9;
        goto LAB_001a1b79;
      }
    }
    uVar4 = ref_cell_remove(local_c8,local_d4);
    local_d0 = (REF_CELL)((long)&local_d0->type + 1);
    if (uVar4 != 0) break;
LAB_001a1d74:
    if ((long)ref_cavity->tri_list->n <= (long)local_d0) {
      local_c8 = (REF_CELL)(pRVar1->cell + 3);
      local_b8 = (REF_CELL)(pRVar1->cell + 8);
      local_d0 = (REF_CELL)0x0;
      goto LAB_001a1f05;
    }
    local_d4 = ref_cavity->tri_list->value[(long)local_d0];
    uVar4 = ref_cell_nodes(local_c8,local_d4,nodes);
    if (uVar4 != 0) {
      pcVar15 = "rm";
      uVar11 = 0x2c5;
      goto LAB_001a175d;
    }
  }
  pcVar15 = "rm tri";
  uVar11 = 0x2cb;
LAB_001a175d:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",uVar11,
         "ref_cavity_replace",(ulong)uVar4,pcVar15);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_replace(REF_CAVITY ref_cavity) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_INT face, seg;
  REF_INT cell, new_cell;
  REF_INT i, item;
  REF_DBL volume;
  REF_LIST ref_list;

  if (ref_cavity_debug(ref_cavity))
    RSS(ref_cavity_tec(ref_cavity, "ref_cavity_replace.tec"),
        "tec for replace fail");

  REIS(REF_CAVITY_VISIBLE, ref_cavity_state(ref_cavity),
       "attempt to replace cavity that is not visible");

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "replace face manifold");
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "replace seg manifold");

  REIS(REF_CAVITY_VISIBLE, ref_cavity_state(ref_cavity),
       "attempt to replace cavity that is inconsistent");

  if (0 == ref_cavity_nseg(ref_cavity) && 0 == ref_cavity_nface(ref_cavity) &&
      0 == ref_list_n(ref_cavity_tri_list(ref_cavity)) &&
      0 == ref_list_n(ref_cavity_tet_list(ref_cavity))) {
    THROW("attempt noop");
  }
  node = ref_cavity_node(ref_cavity);
  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_face(ref_cavity, face) {
    nodes[0] = ref_cavity_f2n(ref_cavity, 0, face);
    nodes[1] = ref_cavity_f2n(ref_cavity, 1, face);
    nodes[2] = ref_cavity_f2n(ref_cavity, 2, face);
    nodes[3] = node;
    if (node == nodes[0] || node == nodes[1] || node == nodes[2])
      continue; /* attached face */
    for (i = 0; i < 4; i++) {
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity tet nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity tet nodes not local");
    }
    RSS(ref_cell_add(ref_cell, nodes, &cell), "add");
    RSS(ref_node_tet_vol(ref_node, nodes, &volume), "norm");
    if (volume <= ref_node_min_volume(ref_node))
      printf("%d %d %d %d %e\n", nodes[0], nodes[1], nodes[2], nodes[3],
             volume);
  }

  node = ref_cavity_seg_node(ref_cavity);
  ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  each_ref_cavity_valid_seg(ref_cavity, seg) {
    nodes[0] = ref_cavity_s2n(ref_cavity, 0, seg);
    nodes[1] = ref_cavity_s2n(ref_cavity, 1, seg);
    nodes[2] = node;
    nodes[3] = ref_cavity_s2n(ref_cavity, 2, seg);
    if (node == nodes[0] || node == nodes[1]) continue; /* attached seg */
    for (i = 0; i < 3; i++) {
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity tri nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity tri nodes not local");
    }
    RSS(ref_cell_add(ref_cell, nodes, &cell), "add");
    /* check validity, area? */
  }

  RSS(ref_list_create(&ref_list), "create removed node list");

  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_list_item(ref_cavity_tet_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tet_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "rm");
    for (i = 0; i < 4; i++) {
      RSS(ref_list_push(ref_list, nodes[i]), "tet list");
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity rm tet nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity rm tet nodes not local");
    }
    RSS(ref_cell_remove(ref_cell, cell), "rm tet");
  }

  ref_cell = ref_grid_tri(ref_cavity_grid(ref_cavity));
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "rm");
    for (i = 0; i < 3; i++) {
      RSS(ref_list_push(ref_list, nodes[i]), "tri list");
      RAS(ref_node_valid(ref_node, nodes[i]), "cavity rm tri nodes not valid");
      RAS(ref_node_owned(ref_node, nodes[i]), "cavity rm tri nodes not local");
    }
    RSS(ref_cell_remove(ref_cell, cell), "rm tri");
  }

  each_ref_list_item(ref_list, item) {
    node = ref_list_value(ref_list, item);
    if (ref_node_valid(ref_node, node)) {
      if (ref_cell_node_empty(ref_grid_tri(ref_grid), node)) {
        RSS(ref_geom_remove_all(ref_geom, node), "remove geom");
      }
      if (ref_cell_node_empty(ref_grid_tri(ref_grid), node) &&
          ref_cell_node_empty(ref_grid_tet(ref_grid), node)) {
        RSS(ref_node_remove(ref_node, node), "remove node");
      }
    }
  }

  if (ref_cavity->split_node0 != REF_EMPTY &&
      ref_cavity->split_node1 != REF_EMPTY) {
    nodes[0] = ref_cavity->split_node0;
    nodes[1] = ref_cavity->split_node1;
    ref_cell = ref_grid_edg(ref_cavity_grid(ref_cavity));
    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND, "find edg");
    if (REF_EMPTY != cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_cell_remove(ref_cell, cell), "remove");
      nodes[0] = ref_cavity->split_node0;
      nodes[1] = ref_cavity_seg_node(ref_cavity);
      RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
      nodes[0] = ref_cavity_seg_node(ref_cavity);
      nodes[1] = ref_cavity->split_node1;
      RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    }
  }

  if (ref_cavity->collapse_node0 != REF_EMPTY &&
      ref_cavity->collapse_node1 != REF_EMPTY) {
    nodes[0] = ref_cavity->collapse_node0;
    nodes[1] = ref_cavity->collapse_node1;
    ref_cell = ref_grid_edg(ref_cavity_grid(ref_cavity));
    RXS(ref_cell_with(ref_cell, nodes, &cell), REF_NOT_FOUND, "find edg");
    if (REF_EMPTY != cell) {
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      RSS(ref_cell_remove(ref_cell, cell), "remove");
      RSS(ref_cell_replace_node(ref_cell, ref_cavity->collapse_node1,
                                ref_cavity->collapse_node0),
          "replace node");
    }
  }

  /* self check to catch invalid node early */
  node = ref_cavity_node(ref_cavity);
  ref_cell = ref_grid_tet(ref_cavity_grid(ref_cavity));
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "");
    for (i = 0; i < 4; i++) {
      RAS(ref_node_valid(ref_node, nodes[i]),
          "cavity replaced tet nodes not valid");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid))
    ref_cell = ref_grid_tri(ref_grid);

  each_ref_list_item(ref_list, item) {
    node = ref_list_value(ref_list, item);
    if (ref_node_valid(ref_node, node)) {
      RAS(!ref_cell_node_empty(ref_cell, node),
          "element missing for valid node");
    }
  }

  RSS(ref_list_free(ref_list), "list free");

  return REF_SUCCESS;
}